

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderFragDataTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::FragDataIndexingCase::iterate(FragDataIndexingCase *this)

{
  size_type *psVar1;
  undefined1 *puVar2;
  IndexExprType IVar3;
  RenderContext *renderCtx;
  code *pcVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  deUint32 dVar12;
  undefined4 extraout_var;
  TextureFormat TVar13;
  void *__dest;
  long *plVar14;
  TextureFormat *pTVar15;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TestError *this_00;
  long *plVar16;
  byte bVar17;
  char *description;
  uint uVar18;
  long lVar19;
  uint uVar20;
  pointer *ppbVar21;
  int height;
  uint uVar22;
  uint uVar23;
  Surface result;
  deUint8 indices [6];
  size_type __dnew_1;
  float positions [8];
  float colors [16];
  VertexArrayBinding vertexArrays [3];
  float indexValues [4];
  ShaderProgram program;
  undefined1 local_318 [8];
  TextureFormat local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  undefined4 local_2f0;
  Surface local_2e8;
  FragDataIndexingCase *local_2c8;
  undefined4 local_2c0;
  undefined2 local_2bc;
  TextureFormat local_2b8;
  long local_2b0;
  long local_2a8 [2];
  undefined1 local_298 [40];
  long local_270;
  AttribLocationBinding local_268;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  long *local_228;
  long local_220;
  long local_218 [2];
  undefined1 local_208 [8];
  _Alloc_hider local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  int iStack_1d0;
  int iStack_1cc;
  int local_1c8;
  pointer local_1c0;
  PrimitiveType local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_178;
  pointer *local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  uint uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_128;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  ShaderProgram local_100;
  
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar9 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  uStack_140 = uStack_140 & 0xffffff00;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_2c8 = this;
  memset(local_208,0,0xac);
  local_318 = (undefined1  [8])&local_308;
  local_298._0_4_ = 0xf3;
  local_298._4_4_ = SNORM_INT8;
  TVar13 = (TextureFormat)std::__cxx11::string::_M_create((ulong *)local_318,(ulong)local_298);
  uVar6 = local_298._0_8_;
  local_308._M_allocated_capacity = local_298._0_8_;
  local_318 = (undefined1  [8])TVar13;
  memcpy((void *)TVar13,
         "attribute highp vec4 a_position;\nattribute highp float a_index;\nattribute highp vec4 a_color;\nvarying mediump float v_index;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n\tv_index = a_index;\n}\n"
         ,0xf3);
  uVar7 = local_298._0_8_;
  local_298._0_4_ = (undefined4)uVar6;
  local_298._4_4_ = SUB84(uVar6,4);
  local_310.order = local_298._0_4_;
  local_310.type = local_298._4_4_;
  *(char *)((long)TVar13 + uVar6) = '\0';
  psVar1 = &local_268.name._M_string_length;
  local_268.name._M_dataplus._M_p = (pointer)((ulong)local_268.name._M_dataplus._M_p._4_4_ << 0x20);
  puVar2 = (undefined1 *)((long)&local_268.name.field_2 + 8);
  local_298._0_8_ = uVar7;
  local_268.name._M_string_length = (size_type)puVar2;
  std::__cxx11::string::_M_construct<char*>((string *)psVar1,local_318,uVar6 + (long)local_318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_208 + ((ulong)local_268.name._M_dataplus._M_p & 0xffffffff) * 0x18),
              (value_type *)psVar1);
  if ((undefined1 *)local_268.name._M_string_length != puVar2) {
    operator_delete((void *)local_268.name._M_string_length,local_268.name.field_2._8_8_ + 1);
  }
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
  }
  local_2e8._0_8_ = &local_2e8.m_pixels.m_cap;
  local_2b8.order = 0x7a;
  local_2b8.type = SNORM_INT8;
  local_270 = CONCAT44(extraout_var,iVar9);
  __dest = (void *)std::__cxx11::string::_M_create((ulong *)&local_2e8,(ulong)&local_2b8);
  TVar13 = local_2b8;
  local_2e8.m_pixels.m_cap._0_4_ = local_2b8.order;
  local_2e8.m_pixels.m_cap._4_4_ = local_2b8.type;
  local_2e8._0_8_ = __dest;
  memcpy(__dest,
         "varying mediump vec4 v_color;\nvarying mediump float v_index;\nuniform mediump int u_index;\nvoid main (void)\n{\n\tgl_FragData["
         ,0x7a);
  local_2e8.m_pixels.m_ptr = (void *)TVar13;
  *(undefined1 *)((long)__dest + (long)TVar13) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_2e8);
  plVar16 = plVar14 + 2;
  if ((long *)*plVar14 == plVar16) {
    local_298._16_8_ = *plVar16;
    local_298._24_8_ = plVar14[3];
    local_298._0_8_ = local_298 + 0x10;
  }
  else {
    local_298._16_8_ = *plVar16;
    local_298._0_8_ = (long *)*plVar14;
  }
  local_298._8_8_ = plVar14[1];
  *plVar14 = (long)plVar16;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  pTVar15 = (TextureFormat *)std::__cxx11::string::append((char *)local_298);
  TVar13 = (TextureFormat)(pTVar15 + 2);
  if (*pTVar15 == TVar13) {
    local_308._M_allocated_capacity = *(undefined8 *)TVar13;
    local_308._8_4_ = pTVar15[3].order;
    local_308._12_4_ = pTVar15[3].type;
    local_318 = (undefined1  [8])&local_308;
  }
  else {
    local_308._M_allocated_capacity = *(undefined8 *)TVar13;
    local_318 = (undefined1  [8])*pTVar15;
  }
  local_310 = pTVar15[1];
  *pTVar15 = TVar13;
  pTVar15[1].order = R;
  pTVar15[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar15[2].order = R;
  psVar1 = &local_268.name._M_string_length;
  local_268.name._M_dataplus._M_p._0_4_ = 1;
  local_268.name._M_string_length = (size_type)puVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar1,local_318,(long)local_310 + (long)local_318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_208 + ((ulong)local_268.name._M_dataplus._M_p & 0xffffffff) * 0x18),
              (value_type *)psVar1);
  if ((undefined1 *)local_268.name._M_string_length != puVar2) {
    operator_delete((void *)local_268.name._M_string_length,local_268.name.field_2._8_8_ + 1);
  }
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
  }
  puVar5 = &local_2e8.m_pixels.m_cap;
  if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  if ((undefined8 *)local_2e8._0_8_ != puVar5) {
    operator_delete((void *)local_2e8._0_8_,local_2e8.m_pixels.m_cap + 1);
  }
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_178);
  lVar19 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_208 + lVar19));
    lVar19 = lVar19 + -0x18;
  } while (lVar19 != -0x18);
  iVar9 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  iVar9 = *(int *)CONCAT44(extraout_var_00,iVar9);
  if (0x7f < iVar9) {
    iVar9 = 0x80;
  }
  iVar10 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  iVar10 = *(int *)(CONCAT44(extraout_var_01,iVar10) + 4);
  height = 0x80;
  if (iVar10 < 0x80) {
    height = iVar10;
  }
  local_298._16_8_ = 0x3f800000bf800000;
  local_298._24_8_ = &DAT_3f8000003f800000;
  local_298._0_8_ = 0xbf800000bf800000;
  local_298._8_8_ = 0xbf8000003f800000;
  local_238 = 0x3f80000000000000;
  uStack_230 = 0x3f80000000000000;
  local_268.location = 0;
  local_268._36_4_ = 0x3f800000;
  uStack_240 = 0x3f80000000000000;
  local_268.name.field_2._M_allocated_capacity = 0x3f80000000000000;
  local_268.name.field_2._8_8_ = 0x3f80000000000000;
  local_268.name._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_268.name._M_string_length = 0x3f80000000000000;
  local_118 = 0;
  uStack_110 = 0;
  local_2bc = 0x301;
  local_2c0 = 0x2020100;
  local_2e8._0_8_ = puVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"a_position","");
  local_318._0_4_ = A;
  TVar13 = (TextureFormat)((long)local_308._M_local_buf + 8);
  local_310 = TVar13;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,local_2e8._0_8_,(long)local_2e8.m_pixels.m_ptr + local_2e8._0_8_);
  local_2f0 = 0;
  local_208._0_4_ = local_318._0_4_;
  local_200._M_p = (pointer)&local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,local_310,
             (char *)(local_308._M_allocated_capacity + (long)local_310));
  local_1f0.field_2._M_allocated_capacity._0_4_ = local_2f0;
  local_1f0.field_2._8_4_ = 8;
  local_1f0.field_2._12_4_ = 0;
  iStack_1d0 = 2;
  iStack_1cc = 4;
  local_1c8 = 0;
  local_1c0 = (pointer)local_298;
  if (local_310 != TVar13) {
    operator_delete((void *)local_310,CONCAT44(local_308._12_4_,local_308._8_4_) + 1);
  }
  local_2b8 = (TextureFormat)local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"a_color","");
  local_318._0_4_ = A;
  local_310 = TVar13;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,local_2b8,local_2b0 + (long)local_2b8);
  local_2f0 = 0;
  local_1b8 = local_318._0_4_;
  local_1b0[0] = &local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b0,local_310,
             (char *)(local_308._M_allocated_capacity + (long)local_310));
  local_1a0.field_2._M_allocated_capacity._0_4_ = local_2f0;
  local_1a0.field_2._8_4_ = 8;
  local_1a0.field_2._12_4_ = 0;
  uStack_180 = 4;
  uStack_17c = 4;
  local_178.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_178.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = &local_268;
  if (local_310 != TVar13) {
    operator_delete((void *)local_310,CONCAT44(local_308._12_4_,local_308._8_4_) + 1);
  }
  local_228 = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"a_index","");
  local_318._0_4_ = A;
  local_310 = TVar13;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,local_228,local_220 + (long)local_228);
  local_2f0._0_1_ = false;
  local_2f0._1_3_ = 0;
  local_178.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_318._0_4_;
  ppbVar21 = &local_158.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_160 = ppbVar21;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_310,
             (char *)(local_308._M_allocated_capacity + (long)local_310));
  uStack_140 = local_2f0;
  local_138 = 8;
  uStack_130 = 0x400000001;
  local_128 = 0;
  local_120 = &local_118;
  if (local_310 != TVar13) {
    operator_delete((void *)local_310,CONCAT44(local_308._12_4_,local_308._8_4_) + 1);
  }
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  lVar19 = local_270;
  if (local_2b8 != (TextureFormat)local_2a8) {
    operator_delete((void *)local_2b8,local_2a8[0] + 1);
  }
  if ((size_t *)local_2e8._0_8_ != &local_2e8.m_pixels.m_cap) {
    operator_delete((void *)local_2e8._0_8_,local_2e8.m_pixels.m_cap + 1);
  }
  glu::operator<<(((local_2c8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  &local_100);
  if (local_100.m_program.m_info.linkOk != false) {
    (**(code **)(lVar19 + 0x1c0))(0x3f800000,0,0,0x3f800000);
    (**(code **)(lVar19 + 0x188))(0x4500);
    (**(code **)(lVar19 + 0x1a00))(0,0,iVar9,height);
    (**(code **)(lVar19 + 0x1680))(local_100.m_program.m_program);
    pcVar4 = *(code **)(lVar19 + 0x14f0);
    uVar11 = (**(code **)(lVar19 + 0xb48))(local_100.m_program.m_program,"u_index");
    (*pcVar4)(uVar11,0);
    local_318._0_4_ = R;
    local_318._4_4_ = UNORM_INT32;
    local_310 = (TextureFormat)((ulong)local_310 & 0xffffffff00000000);
    local_308._M_allocated_capacity = (size_type)&local_2c0;
    glu::draw(renderCtx,local_100.m_program.m_program,3,(VertexArrayBinding *)local_208,
              (PrimitiveList *)local_318,(DrawUtilCallback *)0x0);
    dVar12 = (**(code **)(lVar19 + 0x800))();
    glu::checkError(dVar12,"Rendering failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                    ,0xc5);
    tcu::Surface::Surface(&local_2e8,iVar9,height);
    iVar9 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
    lVar19 = CONCAT44(extraout_var_02,iVar9);
    bVar17 = 8 - *(char *)(lVar19 + 8);
    uVar22 = 0;
    if (0 < *(int *)(lVar19 + 0x14)) {
      uVar22 = 0x1000000 << (8U - (char)*(int *)(lVar19 + 0x14) & 0x1f);
    }
    uVar20 = 0x100 << (8U - *(char *)(lVar19 + 0xc) & 0x1f) | 1 << (bVar17 & 0x1f);
    uVar22 = 0x10000 << (8U - *(char *)(lVar19 + 0x10) & 0x1f) | uVar20 | uVar22;
    uVar18 = 1 << (bVar17 & 0x1f) & 0xff;
    if (0xfd < uVar18) {
      uVar18 = 0xfe;
    }
    uVar20 = uVar20 >> 8 & 0xff;
    if (0xfd < uVar20) {
      uVar20 = 0xfe;
    }
    uVar23 = uVar22 >> 0x10 & 0xff;
    if (0xfd < uVar23) {
      uVar23 = 0xfe;
    }
    uVar22 = uVar22 >> 0x18;
    if (0xfd < uVar22) {
      uVar22 = 0xfe;
    }
    local_2b8.order = RGBA;
    local_2b8.type = UNORM_INT8;
    TVar13 = (TextureFormat)local_2e8.m_pixels.m_cap;
    if ((TextureFormat)local_2e8.m_pixels.m_cap != (TextureFormat)0x0) {
      TVar13 = (TextureFormat)local_2e8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_318,&local_2b8,local_2e8.m_width,local_2e8.m_height,1,
               (void *)TVar13);
    glu::readPixels(renderCtx,0,0,(PixelBufferAccess *)local_318);
    dVar12 = (**(code **)(local_270 + 0x800))();
    glu::checkError(dVar12,"Reading pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                    ,0xcd);
    bVar8 = compareSingleColor(((local_2c8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
                               ->m_log,&local_2e8,(RGBA)0xff00ff00,
                               (RGBA)((uVar23 << 0x10 | uVar20 << 8 | uVar18) + uVar22 * 0x1000000 +
                                     0x1010101));
    description = "Image comparison failed";
    if (bVar8) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((local_2c8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar8,
               description);
    tcu::Surface::~Surface(&local_2e8);
    lVar19 = -0xf0;
    do {
      if ((pointer)ppbVar21 != ppbVar21[-2]) {
        operator_delete(ppbVar21[-2],(ulong)((long)&((*ppbVar21)->_M_dataplus)._M_p + 1));
      }
      ppbVar21 = ppbVar21 + -10;
      lVar19 = lVar19 + 0x50;
    } while (lVar19 != 0);
    glu::ShaderProgram::~ShaderProgram(&local_100);
    return STOP;
  }
  IVar3 = local_2c8->m_indexExprType;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  if (IVar3 == INDEX_EXPR_STATIC) {
    tcu::TestError::TestError
              (this_00,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
               ,0xb7);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_318 = (undefined1  [8])&local_308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,"Dynamic indexing of gl_FragData[] not supported","");
  tcu::NotSupportedError::NotSupportedError((NotSupportedError *)this_00,(string *)local_318);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&		renderCtx		= m_context.getRenderContext();
		const glw::Functions&			gl				= renderCtx.getFunctions();
		const glu::ShaderProgram		program			(renderCtx, genSources(m_indexExprType));
		const int						viewportW		= de::min(renderCtx.getRenderTarget().getWidth(), 128);
		const int						viewportH		= de::min(renderCtx.getRenderTarget().getHeight(), 128);

		const float positions[] =
		{
			-1.0f, -1.0f,
			+1.0f, -1.0f,
			-1.0f, +1.0f,
			+1.0f, +1.0f
		};
		const float colors[] =
		{
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f
		};
		const float		indexValues[]	= { 0.0f, 0.0f, 0.0f, 0.0f };
		const deUint8	indices[]		= { 0, 1, 2, 2, 1, 3 };

		const glu::VertexArrayBinding vertexArrays[] =
		{
			glu::va::Float("a_position",	2, 4, 0, &positions[0]),
			glu::va::Float("a_color",		4, 4, 0, &colors[0]),
			glu::va::Float("a_index",		1, 4, 0, &indexValues[0])
		};

		m_testCtx.getLog() << program;

		if (!program.isOk())
		{
			if (m_indexExprType == INDEX_EXPR_STATIC)
				TCU_FAIL("Compile failed");
			else
				throw tcu::NotSupportedError("Dynamic indexing of gl_FragData[] not supported");
		}

		gl.clearColor	(1.0f, 0.0f, 0.0f, 1.0f);
		gl.clear		(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		gl.viewport		(0, 0, viewportW, viewportH);
		gl.useProgram	(program.getProgram());
		gl.uniform1i	(gl.getUniformLocation(program.getProgram(), "u_index"), 0);

		glu::draw(renderCtx, program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed");

		{
			tcu::Surface		result		(viewportW, viewportH);
			const tcu::RGBA		threshold	= renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
			bool				isOk;

			glu::readPixels(renderCtx, 0, 0, result.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

			isOk = compareSingleColor(m_testCtx.getLog(), result, tcu::RGBA::green(), threshold);

			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}